

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

void __thiscall cmCTestLaunch::WriteXML(cmCTestLaunch *this)

{
  cmXMLElement e2;
  string logXML;
  char *local_2b8;
  cmXMLWriter xml;
  cmGeneratedFileStream fxml;
  
  std::__cxx11::string::string((string *)&logXML,(string *)&this->LogDir);
  std::__cxx11::string::append((char *)&logXML);
  std::__cxx11::string::append((string *)&logXML);
  std::__cxx11::string::append((char *)&logXML);
  cmGeneratedFileStream::cmGeneratedFileStream(&fxml,&logXML,false,None);
  cmXMLWriter::cmXMLWriter(&xml,(ostream *)&fxml,2);
  cmXMLElement::cmXMLElement(&e2,&xml,"Failure");
  local_2b8 = "Error";
  if (this->ExitCode == 0) {
    local_2b8 = "Warning";
  }
  cmXMLWriter::Attribute<char_const*>(e2.xmlwr,"type",&local_2b8);
  WriteXMLAction(this,&e2);
  WriteXMLCommand(this,&e2);
  WriteXMLResult(this,&e2);
  WriteXMLLabels(this,&e2);
  cmXMLElement::~cmXMLElement(&e2);
  cmXMLWriter::~cmXMLWriter(&xml);
  cmGeneratedFileStream::~cmGeneratedFileStream(&fxml);
  std::__cxx11::string::~string((string *)&logXML);
  return;
}

Assistant:

void cmCTestLaunch::WriteXML()
{
  // Name the xml file.
  std::string logXML = this->LogDir;
  logXML += this->IsError() ? "error-" : "warning-";
  logXML += this->LogHash;
  logXML += ".xml";

  // Use cmGeneratedFileStream to atomically create the report file.
  cmGeneratedFileStream fxml(logXML);
  cmXMLWriter xml(fxml, 2);
  cmXMLElement e2(xml, "Failure");
  e2.Attribute("type", this->IsError() ? "Error" : "Warning");
  this->WriteXMLAction(e2);
  this->WriteXMLCommand(e2);
  this->WriteXMLResult(e2);
  this->WriteXMLLabels(e2);
}